

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O0

Node ** __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::UArrIntermediateNode::
childByTop(UArrIntermediateNode *this,Top t,bool canCreate)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  byte in_CL;
  Top *in_RDI;
  Top TVar4;
  int i;
  Top *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_38;
  char *local_8;
  
  local_38 = 0;
  while( true ) {
    if (*(int *)(in_RDI[1]._inner._inner._content + 7) <= local_38) {
      if ((in_CL & 1) == 0) {
        local_8 = (char *)0x0;
      }
      else {
        iVar3 = *(int *)(in_RDI[1]._inner._inner._content + 7) + 1;
        *(int *)(in_RDI[1]._inner._inner._content + 7) = iVar3;
        pcVar1 = in_RDI[2]._inner._inner._content + (long)iVar3 * 8 + -1;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        local_8 = in_RDI[2]._inner._inner._content +
                  (long)(*(int *)(in_RDI[1]._inner._inner._content + 7) + -1) * 8 + -1;
      }
      return (Node **)local_8;
    }
    TVar4 = SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node::top
                      ((Node *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    in_stack_ffffffffffffffb0 =
         CONCAT31((int3)((uint)in_stack_ffffffffffffffb0 >> 8),TVar4._inner._inner._content[7]);
    bVar2 = Kernel::operator==(in_RDI,in_stack_ffffffffffffff98);
    if (bVar2) break;
    local_38 = local_38 + 1;
  }
  return (Node **)(in_RDI[2]._inner._inner._content + (long)local_38 * 8 + -1);
}

Assistant:

typename SubstitutionTree<LeafData_>::Node** SubstitutionTree<LeafData_>::UArrIntermediateNode::
	childByTop(TermList::Top t, bool canCreate)
{
  for(int i=0;i<_size;i++) {
    if(t == _nodes[i]->top()) {
      return &_nodes[i];
    }
  }
  if(canCreate) {
    ASS_L(_size,UARR_INTERMEDIATE_NODE_MAX_SIZE);
    ASS_EQ(_nodes[_size],0);
    _nodes[++_size]=0;
    return &_nodes[_size-1];
  }
  return 0;
}